

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triangulated_Surface.h
# Opt level: O1

void __thiscall
Nova::Triangulated_Surface<float>::Write_OBJ(Triangulated_Surface<float> *this,string *filename)

{
  long lVar1;
  pointer pVVar2;
  ostream *this_00;
  ostream *poVar3;
  long *plVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  
  this_00 = (ostream *)Nova::File_Utilities::Safe_Open_Output((string *)filename,false);
  if (this_00 == (ostream *)0x0) {
    return;
  }
  if ((this->super_Point_Cloud<float,_3>).points._data.
      super__Vector_base<Nova::Vector<float,_3,_true>,_std::allocator<Nova::Vector<float,_3,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->super_Point_Cloud<float,_3>).points._data.
      super__Vector_base<Nova::Vector<float,_3,_true>,_std::allocator<Nova::Vector<float,_3,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar7 = 0;
    uVar8 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(this_00,"v ",2);
      uVar6 = lVar7 >> 0x20;
      lVar1 = (long)(this->super_Point_Cloud<float,_3>).points._data.
                    super__Vector_base<Nova::Vector<float,_3,_true>,_std::allocator<Nova::Vector<float,_3,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = ((long)(this->super_Point_Cloud<float,_3>).points._data.
                     super__Vector_base<Nova::Vector<float,_3,_true>,_std::allocator<Nova::Vector<float,_3,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - lVar1 >> 2) * -0x5555555555555555;
      if (uVar5 < uVar6 || uVar5 - uVar6 == 0) goto LAB_001100fb;
      poVar3 = std::ostream::_M_insert<double>((double)*(float *)(lVar1 + uVar6 * 0xc));
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      lVar1 = (long)(this->super_Point_Cloud<float,_3>).points._data.
                    super__Vector_base<Nova::Vector<float,_3,_true>,_std::allocator<Nova::Vector<float,_3,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = ((long)(this->super_Point_Cloud<float,_3>).points._data.
                     super__Vector_base<Nova::Vector<float,_3,_true>,_std::allocator<Nova::Vector<float,_3,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - lVar1 >> 2) * -0x5555555555555555;
      if (uVar5 < uVar6 || uVar5 - uVar6 == 0) goto LAB_001100fb;
      poVar3 = std::ostream::_M_insert<double>((double)*(float *)(lVar1 + 4 + uVar6 * 0xc));
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      lVar1 = (long)(this->super_Point_Cloud<float,_3>).points._data.
                    super__Vector_base<Nova::Vector<float,_3,_true>,_std::allocator<Nova::Vector<float,_3,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = ((long)(this->super_Point_Cloud<float,_3>).points._data.
                     super__Vector_base<Nova::Vector<float,_3,_true>,_std::allocator<Nova::Vector<float,_3,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - lVar1 >> 2) * -0x5555555555555555;
      if (uVar5 < uVar6 || uVar5 - uVar6 == 0) goto LAB_001100fb;
      poVar3 = std::ostream::_M_insert<double>((double)*(float *)(lVar1 + 8 + uVar6 * 0xc));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x100000000;
    } while (uVar8 < (ulong)(((long)(this->super_Point_Cloud<float,_3>).points._data.
                                    super__Vector_base<Nova::Vector<float,_3,_true>,_std::allocator<Nova::Vector<float,_3,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->super_Point_Cloud<float,_3>).points._data.
                                    super__Vector_base<Nova::Vector<float,_3,_true>,_std::allocator<Nova::Vector<float,_3,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 2) *
                            -0x5555555555555555));
  }
  if ((this->super_Simplex_Mesh<3>).elements._data.
      super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->super_Simplex_Mesh<3>).elements._data.
      super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    lVar7 = 0;
    uVar8 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(this_00,"f ",2);
      uVar6 = lVar7 >> 0x20;
      pVVar2 = (this->super_Simplex_Mesh<3>).elements._data.
               super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = ((long)(this->super_Simplex_Mesh<3>).elements._data.
                     super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 2) *
              -0x5555555555555555;
      if (uVar5 < uVar6 || uVar5 - uVar6 == 0) {
LAB_001100fb:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar6
                  );
      }
      poVar3 = (ostream *)
               std::ostream::operator<<((ostream *)this_00,pVVar2[uVar6]._data._M_elems[0] + 1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      pVVar2 = (this->super_Simplex_Mesh<3>).elements._data.
               super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = ((long)(this->super_Simplex_Mesh<3>).elements._data.
                     super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 2) *
              -0x5555555555555555;
      if (uVar5 < uVar6 || uVar5 - uVar6 == 0) goto LAB_001100fb;
      poVar3 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar3,*(int *)((long)pVVar2[uVar6]._data._M_elems + 4) + 1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      pVVar2 = (this->super_Simplex_Mesh<3>).elements._data.
               super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = ((long)(this->super_Simplex_Mesh<3>).elements._data.
                     super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 2) *
              -0x5555555555555555;
      if (uVar5 < uVar6 || uVar5 - uVar6 == 0) goto LAB_001100fb;
      plVar4 = (long *)std::ostream::operator<<
                                 ((ostream *)poVar3,
                                  *(int *)((long)pVVar2[uVar6]._data._M_elems + 8) + 1);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x100000000;
    } while (uVar8 < (ulong)(((long)(this->super_Simplex_Mesh<3>).elements._data.
                                    super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->super_Simplex_Mesh<3>).elements._data.
                                    super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 2) *
                            -0x5555555555555555));
  }
  (**(code **)(*(long *)this_00 + 8))(this_00);
  return;
}

Assistant:

void Write_OBJ(const std::string& filename)
    {
        std::ostream *output=File_Utilities::Safe_Open_Output(filename,false);
        if(output!=nullptr)
        {
            for(size_t i=0;i<points.size();++i) *output<<"v "<<points[i][0]<<" "<<points[i][1]<<" "<<points[i][2]<<std::endl;
            for(size_t i=0;i<elements.size();++i) *output<<"f "<<elements[i][0]+1<<" "<<elements[i][1]+1<<" "<<elements[i][2]+1<<std::endl;
        }
        delete output;
    }